

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeMemoryInit<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  Index IVar1;
  NullInstrParserCtx *pNVar2;
  Err *pEVar3;
  Ok *pOVar4;
  undefined1 local_b0 [8];
  Result<wasm::Ok> data;
  undefined1 local_78 [8];
  MaybeResult<wasm::Ok> mem;
  anon_class_32_4_a44794c9 retry;
  size_t reset;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  NullInstrParserCtx *pNStack_18;
  Index pos_local;
  NullCtx *ctx_local;
  
  annotations_local._4_4_ = pos;
  pNStack_18 = (NullInstrParserCtx *)ctx;
  ctx_local = (NullCtx *)__return_storage_ptr__;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       Lexer::getPos(&ctx->in);
  mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = pNStack_18;
  retry.ctx = (NullCtx *)&retry.annotations;
  retry.reset = (size_t *)((long)&annotations_local + 4);
  retry.pos = (Index *)annotations;
  maybeMemidx<wasm::WATParser::NullCtx>((MaybeResult<wasm::Ok> *)local_78,(NullCtx *)pNStack_18);
  pEVar3 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_78);
  if (pEVar3 == (Err *)0x0) {
    dataidx<wasm::WATParser::NullCtx>((Result<wasm::Ok> *)local_b0,(NullCtx *)pNStack_18);
    pEVar3 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_b0);
    pNVar2 = pNStack_18;
    IVar1 = annotations_local._4_4_;
    if (pEVar3 == (Err *)0x0) {
      pOVar4 = MaybeResult<wasm::Ok>::getPtr((MaybeResult<wasm::Ok> *)local_78);
      Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_b0);
      NullInstrParserCtx::makeMemoryInit(__return_storage_ptr__,pNVar2,IVar1,annotations,pOVar4);
    }
    else {
      makeMemoryInit<wasm::WATParser::NullCtx>::anon_class_32_4_a44794c9::operator()
                (__return_storage_ptr__,
                 (anon_class_32_4_a44794c9 *)
                 ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    }
    data.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_index = '\x01';
    data.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _33_3_ = 0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_b0);
  }
  else {
    makeMemoryInit<wasm::WATParser::NullCtx>::anon_class_32_4_a44794c9::operator()
              (__return_storage_ptr__,
               (anon_class_32_4_a44794c9 *)
               ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    data.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_index = '\x01';
    data.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _33_3_ = 0;
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryInit(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the data index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto data = dataidx(ctx);
    CHECK_ERR(data);
    return ctx.makeMemoryInit(pos, annotations, nullptr, *data);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto data = dataidx(ctx);
  if (data.getErr()) {
    return retry();
  }
  return ctx.makeMemoryInit(pos, annotations, mem.getPtr(), *data);
}